

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::invMatrix(float *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float result [9];
  double d;
  double e6;
  double e3;
  double e0;
  int i;
  float *m_local;
  uint local_4;
  
  fVar5 = m[4] * m[8] + -(m[5] * m[7]);
  fVar4 = m[5] * m[6] + -(m[3] * m[8]);
  fVar3 = m[3] * m[7] + -(m[4] * m[6]);
  fVar1 = 1.0 / (m[2] * fVar3 + *m * fVar5 + m[1] * fVar4);
  fVar2 = fVar1;
  if (fVar1 <= 0.0) {
    fVar2 = -fVar1;
  }
  if (fVar2 <= 1e+15) {
    result[0] = fVar5 * fVar1;
    result[1] = (m[2] * m[7] + -(m[1] * m[8])) * fVar1;
    result[2] = (m[1] * m[5] + -(m[2] * m[4])) * fVar1;
    result[3] = fVar4 * fVar1;
    result[4] = (*m * m[8] + -(m[2] * m[6])) * fVar1;
    result[5] = (m[3] * m[2] + -(*m * m[5])) * fVar1;
    result[6] = fVar3 * fVar1;
    result[7] = (m[6] * m[1] + -(*m * m[7])) * fVar1;
    result[8] = (*m * m[4] + -(m[3] * m[1])) * fVar1;
    for (i = 0; i < 9; i = i + 1) {
      m[i] = result[i];
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static unsigned invMatrix(float* m) {
  int i;
  /* double used instead of float for intermediate computations to avoid
  intermediate numerical precision issues */
  double e0 = (double)m[4] * m[8] - (double)m[5] * m[7];
  double e3 = (double)m[5] * m[6] - (double)m[3] * m[8];
  double e6 = (double)m[3] * m[7] - (double)m[4] * m[6];
  /* inverse determinant */
  double d = 1.0 / (m[0] * e0 + m[1] * e3 + m[2] * e6);
  float result[9];
  if((d > 0 ? d : -d) > 1e15) return 1; /* error, likely not invertible */
  result[0] = e0 * d;
  result[1] = ((double)m[2] * m[7] - (double)m[1] * m[8]) * d;
  result[2] = ((double)m[1] * m[5] - (double)m[2] * m[4]) * d;
  result[3] = e3 * d;
  result[4] = ((double)m[0] * m[8] - (double)m[2] * m[6]) * d;
  result[5] = ((double)m[3] * m[2] - (double)m[0] * m[5]) * d;
  result[6] = e6 * d;
  result[7] = ((double)m[6] * m[1] - (double)m[0] * m[7]) * d;
  result[8] = ((double)m[0] * m[4] - (double)m[3] * m[1]) * d;
  for(i = 0; i < 9; i++) m[i] = result[i];
  return 0; /* ok */
}